

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp,char *path,uint path_len,long mode)

{
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  uint32_t uVar3;
  uchar *buf;
  ssize_t sVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  unsigned_long flags;
  ulong buflen;
  uchar *s;
  uchar *local_a0;
  int local_94;
  size_t data_len;
  ulong local_88;
  char *local_80;
  ulong local_78;
  time_t local_70;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  
  if (sftp == (LIBSSH2_SFTP *)0x0) {
    iVar2 = -0x27;
  }
  else {
    local_80 = path;
    local_70 = time((time_t *)0x0);
    local_78 = mode | 0x4000;
    local_88 = (ulong)path_len;
    iVar7 = path_len + 0xd;
    local_94 = iVar7;
    do {
      channel = sftp->channel;
      pLVar1 = channel->session;
      attrs.permissions = 0;
      attrs.atime = 0;
      attrs.uid = 0;
      attrs.gid = 0;
      attrs.mtime = 0;
      attrs.flags = 0;
      attrs.filesize = 0;
      data_len = 0;
      local_a0 = (uchar *)0x0;
      if (mode == -1) {
        flags = 0;
      }
      else {
        attrs.flags = 4;
        attrs.permissions = local_78;
        flags = 4;
      }
      iVar2 = sftp_attrsize(flags);
      buflen = (ulong)(uint)(iVar2 + iVar7);
      if (sftp->mkdir_state == libssh2_NB_state_idle) {
        sftp->last_errno = 0;
        buf = (uchar *)(*pLVar1->alloc)(buflen,&pLVar1->abstract);
        if (buf != (uchar *)0x0) {
          s = buf;
          _libssh2_store_u32(&s,(iVar2 + iVar7) - 4);
          *s = '\x0e';
          uVar3 = sftp->request_id;
          sftp->request_id = uVar3 + 1;
          sftp->mkdir_request_id = uVar3;
          s = s + 1;
          _libssh2_store_u32(&s,uVar3);
          iVar7 = local_94;
          _libssh2_store_str(&s,local_80,local_88);
          sVar4 = sftp_attr2bin(s,&attrs);
          s = s + sVar4;
          sftp->mkdir_state = libssh2_NB_state_created;
          goto LAB_0012409c;
        }
        iVar2 = -6;
        pcVar6 = "Unable to allocate memory for FXP_MKDIR packet";
        s = (uchar *)0x0;
LAB_001241a9:
        iVar2 = _libssh2_error(pLVar1,iVar2,pcVar6);
LAB_001241ce:
        if (iVar2 != -0x25) {
          return iVar2;
        }
      }
      else {
        if (sftp->mkdir_state != libssh2_NB_state_created) {
LAB_001240f1:
          iVar2 = sftp_packet_require(sftp,'e',sftp->mkdir_request_id,&local_a0,&data_len,9);
          if (iVar2 == 0) {
            sftp->mkdir_state = libssh2_NB_state_idle;
            uVar3 = _libssh2_ntohu32(local_a0 + 5);
            (*pLVar1->free)(local_a0,&pLVar1->abstract);
            if (uVar3 == 0) {
              return 0;
            }
            sftp->last_errno = uVar3;
            iVar2 = -0x1f;
            pcVar6 = "SFTP Protocol Error";
            goto LAB_001241a9;
          }
          if (iVar2 == -0x25) goto LAB_001241d3;
          if (iVar2 == -0x26) {
            if (data_len != 0) {
              (*pLVar1->free)(local_a0,&pLVar1->abstract);
            }
            iVar2 = -0x1f;
            pcVar6 = "SFTP mkdir packet too short";
          }
          else {
            sftp->mkdir_state = libssh2_NB_state_idle;
            pcVar6 = "Error waiting for FXP STATUS";
          }
          iVar2 = _libssh2_error(pLVar1,iVar2,pcVar6);
          goto LAB_001241ce;
        }
        buf = sftp->mkdir_packet;
LAB_0012409c:
        uVar5 = _libssh2_channel_write(channel,0,buf,buflen);
        if (uVar5 != 0xffffffffffffffdb) {
          (*pLVar1->free)(buf,&pLVar1->abstract);
          if (uVar5 != buflen) {
            sftp->mkdir_state = libssh2_NB_state_idle;
            iVar2 = -7;
            pcVar6 = "_libssh2_channel_write() failed";
            goto LAB_001241a9;
          }
          sftp->mkdir_state = libssh2_NB_state_sent;
          sftp->mkdir_packet = (uchar *)0x0;
          goto LAB_001240f1;
        }
        sftp->mkdir_packet = buf;
      }
LAB_001241d3:
      pLVar1 = sftp->channel->session;
      if (pLVar1->api_block_mode == 0) {
        return -0x25;
      }
      iVar2 = _libssh2_wait_socket(pLVar1,local_70);
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_mkdir_ex(LIBSSH2_SFTP *sftp, const char *path,
                      unsigned int path_len, long mode)
{
    int rc;
    if(!sftp)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, sftp->channel->session,
                 sftp_mkdir(sftp, path, path_len, mode));
    return rc;
}